

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O1

void __thiscall
GlobOpt::KillObjectHeaderInlinedTypeSyms
          (GlobOpt *this,BasicBlock *block,bool isObjTypeSpecialized,SymID opndId)

{
  int iVar1;
  EquivalentTypeSet *this_00;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  TypeId TVar6;
  undefined4 *puVar7;
  Value *pVVar8;
  JsTypeValueInfo *pJVar9;
  JITType *pJVar10;
  JITTypeHandler *pJVar11;
  uint16 index;
  BVIndex typeSymId;
  int iVar12;
  void *pvVar13;
  ulong uVar14;
  bool bVar15;
  nullptr_t local_50;
  JITTypeHolderBase<void> local_48;
  JITTypeHolder type;
  
  if ((this->objectTypeSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0) &&
     (type.t = (Type)this->objectTypeSyms->head, (Type_conflict)type.t != (Type_conflict)0x0)) {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      pvVar13 = ((type.t)->m_data).protoAddr.ptr;
      if (pvVar13 != (void *)0x0) {
        iVar1 = *(int *)&((type.t)->m_data).libAddr.ptr;
        uVar14 = 0;
        if (pvVar13 != (void *)0x0) {
          for (; ((ulong)pvVar13 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
          }
        }
        bVar15 = false;
        do {
          typeSymId = (BVIndex)uVar14 + iVar1;
          BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar14);
          if ((typeSymId != opndId || !isObjTypeSpecialized) &&
             (pVVar8 = GlobOptBlockData::FindObjectTypeValue(&block->globOptData,typeSymId),
             pVVar8 != (Value *)0x0)) {
            pJVar9 = ValueInfo::AsJsType(pVVar8->valueInfo);
            if (pJVar9 == (JsTypeValueInfo *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar7 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                                 ,0x3f7,"(valueInfo)","valueInfo");
              if (!bVar4) {
                pcVar3 = (code *)invalidInstructionException();
                (*pcVar3)();
              }
              *puVar7 = 0;
            }
            local_48.t = (pJVar9->jsType).t;
            local_50 = (nullptr_t)0x0;
            bVar4 = JITTypeHolderBase<void>::operator!=(&local_48,&local_50);
            if (bVar4) {
              local_48.t = (pJVar9->jsType).t;
              pJVar10 = JITTypeHolderBase<void>::operator->(&local_48);
              TVar6 = JITType::GetTypeId(pJVar10);
              bVar4 = Js::DynamicType::Is(TVar6);
              if (bVar4) {
                pJVar10 = JITTypeHolderBase<void>::operator->(&local_48);
                pJVar11 = JITType::GetTypeHandler(pJVar10);
                bVar4 = JITTypeHandler::IsObjectHeaderInlinedTypeHandler(pJVar11);
                if (bVar4) {
                  BVSparse<Memory::JitArenaAllocator>::Clear
                            ((this->currentBlock->globOptData).liveFields,typeSymId);
                }
              }
LAB_004a1ae0:
              iVar12 = 0;
            }
            else {
              this_00 = pJVar9->jsTypeSet;
              if (this_00 == (EquivalentTypeSet *)0x0) goto LAB_004a1ae0;
              if (this_00->count != 0) {
                index = 0;
                do {
                  local_48.t = (Type)Js::EquivalentTypeSet::GetType(this_00,index);
                  local_50 = (nullptr_t)0x0;
                  bVar4 = JITTypeHolderBase<void>::operator!=(&local_48,&local_50);
                  if (bVar4) {
                    pJVar10 = JITTypeHolderBase<void>::operator->(&local_48);
                    TVar6 = JITType::GetTypeId(pJVar10);
                    bVar5 = Js::DynamicType::Is(TVar6);
                    iVar12 = 0;
                    bVar4 = true;
                    if (bVar5) {
                      pJVar10 = JITTypeHolderBase<void>::operator->(&local_48);
                      pJVar11 = JITType::GetTypeHandler(pJVar10);
                      bVar5 = JITTypeHandler::IsObjectHeaderInlinedTypeHandler(pJVar11);
                      if (bVar5) {
                        BVSparse<Memory::JitArenaAllocator>::Clear
                                  ((this->currentBlock->globOptData).liveFields,typeSymId);
                        iVar12 = 10;
                        bVar4 = false;
                      }
                    }
                  }
                  else {
                    iVar12 = 0;
                    bVar4 = true;
                  }
                  if (!bVar4) goto LAB_004a1ad1;
                  index = index + 1;
                } while (index < this_00->count);
              }
              iVar12 = 10;
LAB_004a1ad1:
              if (iVar12 == 10) goto LAB_004a1ae0;
            }
            if (iVar12 != 0) {
              if (!bVar15) {
                return;
              }
              break;
            }
          }
          pvVar13 = (void *)((ulong)pvVar13 & ~(1L << (uVar14 & 0x3f)));
          lVar2 = 0;
          if (pvVar13 != (void *)0x0) {
            for (; ((ulong)pvVar13 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
            }
          }
          uVar14 = (ulong)(-(uint)(pvVar13 == (void *)0x0) | (uint)lVar2);
          bVar15 = pvVar13 == (void *)0x0;
        } while (!bVar15);
      }
      type.t = *(Type *)&(type.t)->m_data;
    } while (type.t != (Type)0x0);
  }
  return;
}

Assistant:

void
GlobOpt::KillObjectHeaderInlinedTypeSyms(BasicBlock *block, bool isObjTypeSpecialized, SymID opndId)
{
    this->MapObjectHeaderInlinedTypeSymsUntil(block, isObjTypeSpecialized, opndId, [&](SymID symId)->bool  { this->currentBlock->globOptData.liveFields->Clear(symId); return false; });
}